

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Mutex::lock(Mutex *this,Exclusivity exclusivity)

{
  bool bVar1;
  uint local_2c;
  uint state_1;
  uint local_18;
  uint state;
  Exclusivity exclusivity_local;
  Mutex *this_local;
  
  if (exclusivity == EXCLUSIVE) {
LAB_009c2eb6:
    LOCK();
    local_18 = this->futex;
    bVar1 = local_18 == 0;
    if (bVar1) {
      this->futex = 0x80000000;
      local_18 = 0;
    }
    UNLOCK();
    if (!bVar1) {
      if ((local_18 & 0x40000000) == 0) goto code_r0x009c2f07;
      goto LAB_009c2f53;
    }
  }
  else if (exclusivity == SHARED) {
    LOCK();
    local_2c = this->futex;
    this->futex = this->futex + 1;
    UNLOCK();
    local_2c = local_2c + 1;
    while ((local_2c & 0x80000000) != 0) {
      syscall(0xca,this,0x80,(ulong)local_2c,0,0,0);
      local_2c = this->futex;
    }
  }
  return;
code_r0x009c2f07:
  LOCK();
  bVar1 = local_18 == this->futex;
  if (bVar1) {
    this->futex = local_18 | 0x40000000;
  }
  UNLOCK();
  if (bVar1) {
    local_18 = local_18 | 0x40000000;
LAB_009c2f53:
    syscall(0xca,this,0x80,(ulong)local_18,0,0,0);
  }
  goto LAB_009c2eb6;
}

Assistant:

void Mutex::lock(Exclusivity exclusivity) {
  switch (exclusivity) {
    case EXCLUSIVE:
      for (;;) {
        uint state = 0;
        if (KJ_LIKELY(__atomic_compare_exchange_n(&futex, &state, EXCLUSIVE_HELD, false,
                                                  __ATOMIC_ACQUIRE, __ATOMIC_RELAXED))) {
          // Acquired.
          break;
        }

        // The mutex is contended.  Set the exclusive-requested bit and wait.
        if ((state & EXCLUSIVE_REQUESTED) == 0) {
          if (!__atomic_compare_exchange_n(&futex, &state, state | EXCLUSIVE_REQUESTED, false,
                                           __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
            // Oops, the state changed before we could set the request bit.  Start over.
            continue;
          }

          state |= EXCLUSIVE_REQUESTED;
        }

        syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, NULL, NULL, 0);
      }
      break;
    case SHARED: {
      uint state = __atomic_add_fetch(&futex, 1, __ATOMIC_ACQUIRE);
      for (;;) {
        if (KJ_LIKELY((state & EXCLUSIVE_HELD) == 0)) {
          // Acquired.
          break;
        }

        // The mutex is exclusively locked by another thread.  Since we incremented the counter
        // already, we just have to wait for it to be unlocked.
        syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, NULL, NULL, 0);
        state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);
      }
      break;
    }
  }
}